

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_loadn(ASMState *as,Reg r,cTValue *tv)

{
  long *in_RDX;
  Reg in_ESI;
  x86Op xo;
  ASMState *in_RDI;
  
  if (*in_RDX == 0) {
    emit_rr(in_RDI,XO_XORPS,in_ESI,in_ESI);
  }
  else {
    xo = XO_MOVSD;
    if ((in_RDI->flags & 0x400) != 0) {
      xo = XO_MOVLPD;
    }
    emit_rma(in_RDI,xo,in_ESI,in_RDX);
  }
  return;
}

Assistant:

static void emit_loadn(ASMState *as, Reg r, cTValue *tv)
{
  if (tvispzero(tv))  /* Use xor only for +0. */
    emit_rr(as, XO_XORPS, r, r);
  else
    emit_rma(as, XMM_MOVRM(as), r, &tv->n);
}